

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field.cpp
# Opt level: O3

double __thiscall bidfx_public_api::price::PriceField::GetDouble(PriceField *this)

{
  logic_error *this_00;
  
  if (this->type_ == DOUBLE) {
    return (double)(this->field_1).long_value_;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"price field is not of type Double");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

double PriceField::GetDouble() const
{
    if (type_ != DOUBLE)
    {
        throw std::logic_error("price field is not of type Double");
    }
    return double_value_;
}